

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::InsertSyntheticTestCase(string *name,CodeLocation *location)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  char *__s;
  pointer pcVar4;
  UnitTestImpl *pUVar5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  const_iterator cVar8;
  long *plVar9;
  TestFactoryBase *factory;
  size_type *psVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long *plVar12;
  string message;
  string full_name;
  allocator<char> local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  TestFactoryBase *local_128;
  undefined8 local_120;
  TestFactoryBase local_118;
  _func_int **pp_Stack_110;
  int local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  CodeLocation local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  _func_int **local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  TestFactoryBase *local_98;
  _func_int **local_90;
  TestFactoryBase local_88;
  _func_int **pp_Stack_80;
  int local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  UnitTest::GetInstance();
  pUVar5 = UnitTest::GetInstance::instance.impl_;
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&((UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_)._M_t
                 ,name);
  if ((_Rb_tree_header *)cVar8._M_node ==
      &(pUVar5->ignored_parameterized_test_suites_)._M_t._M_impl.super__Rb_tree_header) {
    std::operator+(&local_100,"Paramaterized test suite ",name);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_100);
    paVar2 = &local_e0.file.field_2;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_e0.file.field_2._M_allocated_capacity = *psVar10;
      local_e0.file.field_2._8_8_ = plVar9[3];
      local_e0.file._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_e0.file.field_2._M_allocated_capacity = *psVar10;
      local_e0.file._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_e0.file._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_e0,(ulong)(name->_M_dataplus)._M_p);
    paVar1 = &local_148.field_2;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar11) {
      local_148.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_148.field_2._8_8_ = plVar9[3];
      local_148._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_148.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_148._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_148._M_string_length = plVar9[1];
    *plVar9 = (long)paVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_148);
    local_70 = &local_60;
    plVar12 = plVar9 + 2;
    if ((long *)*plVar9 == plVar12) {
      local_60 = *plVar12;
      lStack_58 = plVar9[3];
    }
    else {
      local_60 = *plVar12;
      local_70 = (long *)*plVar9;
    }
    local_68 = plVar9[1];
    *plVar9 = (long)plVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.file._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0.file._M_dataplus._M_p,local_e0.file.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_148,"UninstantiatedParamaterizedTestSuite<",name);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_148);
    local_50 = &local_40;
    plVar12 = plVar9 + 2;
    if ((long *)*plVar9 == plVar12) {
      local_40 = *plVar12;
      lStack_38 = plVar9[3];
    }
    else {
      local_40 = *plVar12;
      local_50 = (long *)*plVar9;
    }
    local_48 = plVar9[1];
    *plVar9 = (long)plVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    plVar9 = local_50;
    __s = (location->file)._M_dataplus._M_p;
    iVar3 = location->line;
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_70,local_68 + (long)local_70);
    pcVar4 = (location->file)._M_dataplus._M_p;
    local_98 = &local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar4,pcVar4 + (location->file)._M_string_length);
    local_78 = location->line;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,__s,&local_149);
    paVar2 = &local_e0.file.field_2;
    local_e0.file._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,local_100._M_dataplus._M_p,
               local_100._M_dataplus._M_p + local_100._M_string_length);
    local_e0.line = iVar3;
    factory = (TestFactoryBase *)operator_new(0x50);
    pp_Var7 = local_90;
    pp_Var6 = local_b0;
    if (local_b8 == &local_a8) {
      local_148.field_2._8_8_ = local_a8._8_8_;
      local_b8 = paVar1;
    }
    local_148.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
    local_148.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
    local_b0 = (_func_int **)0x0;
    local_a8._M_local_buf[0] = '\0';
    if (local_98 == &local_88) {
      pp_Stack_110 = pp_Stack_80;
      local_98 = &local_118;
    }
    local_118._vptr_TestFactoryBase._1_7_ = local_88._vptr_TestFactoryBase._1_7_;
    local_118._vptr_TestFactoryBase._0_1_ = local_88._vptr_TestFactoryBase._0_1_;
    local_90 = (_func_int **)0x0;
    local_88._vptr_TestFactoryBase._0_1_ = 0;
    local_108 = local_78;
    factory->_vptr_TestFactoryBase =
         (_func_int **)
         (
         _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal23InsertSyntheticTestCaseERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEENS2_12CodeLocationEE3__0EEPNS_8TestInfoEPKcSG_SG_SG_SG_iT0_E11FactoryImpl
         + 0x10);
    factory[1]._vptr_TestFactoryBase = (_func_int **)(factory + 3);
    if (local_b8 == paVar1) {
      factory[3]._vptr_TestFactoryBase = (_func_int **)local_148.field_2._M_allocated_capacity;
      factory[4]._vptr_TestFactoryBase = (_func_int **)local_148.field_2._8_8_;
    }
    else {
      factory[1]._vptr_TestFactoryBase = (_func_int **)local_b8;
      factory[3]._vptr_TestFactoryBase = (_func_int **)local_148.field_2._M_allocated_capacity;
    }
    factory[2]._vptr_TestFactoryBase = pp_Var6;
    local_148._M_string_length = 0;
    local_148.field_2._M_allocated_capacity =
         (ulong)(uint7)local_a8._M_allocated_capacity._1_7_ << 8;
    factory[5]._vptr_TestFactoryBase = (_func_int **)(factory + 7);
    if (local_98 == &local_118) {
      factory[7]._vptr_TestFactoryBase = local_118._vptr_TestFactoryBase;
      factory[8]._vptr_TestFactoryBase = pp_Stack_110;
    }
    else {
      factory[5]._vptr_TestFactoryBase = (_func_int **)local_98;
      factory[7]._vptr_TestFactoryBase = local_118._vptr_TestFactoryBase;
    }
    factory[6]._vptr_TestFactoryBase = pp_Var7;
    local_120 = 0;
    local_118._vptr_TestFactoryBase =
         (_func_int **)((ulong)local_88._vptr_TestFactoryBase._1_7_ << 8);
    *(int *)&factory[9]._vptr_TestFactoryBase = local_78;
    local_148._M_dataplus._M_p = (pointer)paVar1;
    local_128 = &local_118;
    local_b8 = &local_a8;
    local_98 = &local_88;
    MakeAndRegisterTestInfo
              ("GoogleTestVerification",(char *)plVar9,(char *)0x0,(char *)0x0,&local_e0,
               &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
               (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
    if (local_128 != &local_118) {
      operator_delete(local_128,(long)local_118._vptr_TestFactoryBase + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.file._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0.file._M_dataplus._M_p,local_e0.file.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(local_88._vptr_TestFactoryBase._1_7_,
                                        local_88._vptr_TestFactoryBase._0_1_) + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT71(local_a8._M_allocated_capacity._1_7_,
                                        local_a8._M_local_buf[0]) + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
  }
  return;
}

Assistant:

void InsertSyntheticTestCase(const std::string &name, CodeLocation location) {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  if (ignored.find(name) != ignored.end()) return;

  std::string message =
      "Paramaterized test suite " + name +
      " is defined via TEST_P, but never instantiated. None of the test cases "
      "will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only "
      "ones provided expand to nothing."
      "\n\n"
      "Ideally, TEST_P definitions should only ever be included as part of "
      "binaries that intend to use them. (As opposed to, for example, being "
      "placed in a library that may be linked in to get other utilities.)"
      "\n\n"
      "To suppress this error for this test suite, insert the following line "
      "(in a non-header) in the namespace it is defined in:"
      "\n\n"
      "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" + name + ");";

  std::string full_name = "UninstantiatedParamaterizedTestSuite<" + name + ">";
  RegisterTest(  //
      "GoogleTestVerification", full_name.c_str(),
      nullptr,  // No type parameter.
      nullptr,  // No value parameter.
      location.file.c_str(), location.line, [message, location] {
        return new FailureTest(location, message,
                               kErrorOnUninstantiatedParameterizedTest);
      });
}